

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::CharacterClassPass1<true>
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this)

{
  uint32 *puVar1;
  SurrogatePairTracker *pSVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  EncodedChar EVar8;
  EncodedChar EVar9;
  Char CVar10;
  codepoint_t codePointValue;
  uint uVar11;
  uint uVar12;
  undefined4 *puVar13;
  Node *pNVar14;
  MatchSetNode *pMVar15;
  undefined8 uVar16;
  MatchSetNode *pMVar17;
  MatchSetNode *pMVar18;
  AltNode *this_00;
  Char CVar19;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPVar20;
  uint n;
  Char CVar21;
  ArenaAllocator *allocator;
  CharSet<unsigned_int> *pCVar22;
  uint uVar23;
  undefined1 local_908 [8];
  CharSet<unsigned_int> negatedSet;
  codepoint_t lowerCharOfRange;
  undefined1 local_3b8 [8];
  CharSet<unsigned_int> codePointSet;
  MatchSetNode deferredSetNode;
  MatchCharNode deferredCharNode;
  Char local_54;
  undefined4 *puStack_50;
  codepoint_t upperCharOfRange;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *local_48;
  MatchSetNode *local_40;
  bool local_31 [8];
  bool previousWasASurrogate;
  
  if (this->unicodeFlagPresent == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x842,"(containsSurrogates ? unicodeFlagPresent : true)",
                       "containsSurrogates ? unicodeFlagPresent : true");
    if (!bVar6) goto LAB_00d2747f;
    *puVar13 = 0;
  }
  CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_3b8);
  MatchSetNode::MatchSetNode
            ((MatchSetNode *)(codePointSet.characterPlanes[0x10].rep.full.direct.vec + 6),false,
             false);
  MatchCharNode::MatchCharNode((MatchCharNode *)(deferredSetNode.set.rep.full.direct.vec + 6),L'\0')
  ;
  EVar8 = ECLookahead(this,0);
  if (EVar8 == L'^') {
    ECConsume(this,1);
  }
  local_48 = this;
  EVar9 = ECLookahead(this,0);
  local_31[0] = false;
  puStack_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  CVar21 = 0xffffffff;
  local_40 = (MatchSetNode *)CONCAT44(local_40._4_4_,0xffffffff);
  bVar6 = false;
  bVar4 = false;
  while (pPVar20 = local_48, EVar9 != L']') {
    if (EVar9 == L'\\') {
      ECConsume(local_48,1);
    }
    pSVar2 = pPVar20->currentSurrogatePairNode;
    CVar19 = CVar21;
    if ((pSVar2 == (SurrogatePairTracker *)0x0) || (pSVar2->location != pPVar20->next)) {
      if (EVar9 == L'\\') {
        pNVar14 = ClassEscapePass1(pPVar20,(MatchCharNode *)
                                           (deferredSetNode.set.rep.full.direct.vec + 6),
                                   (MatchSetNode *)
                                   (codePointSet.characterPlanes[0x10].rep.full.direct.vec + 6),
                                   local_31);
        if (pNVar14->tag != MatchSet) {
          uVar23 = (uint)(ushort)deferredCharNode.super_Node.followConsumes.lower;
          goto LAB_00d26cfb;
        }
        if ((uint)local_40 != -1) {
          if (pPVar20->unicodeFlagPresent == true) {
            Fail(pPVar20,-0x7ff5e9d3);
          }
          CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,0x2d);
        }
        CharSet<unsigned_int>::UnionInPlace
                  ((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,
                   (CharSet<char16_t> *)&deferredSetNode.isNegation);
        bVar5 = 1;
        CVar21 = 0xffffffff;
        uVar23 = 0xffffffff;
      }
      else {
        if (EVar9 != L'-') {
          CVar10 = NextChar(pPVar20);
          uVar23 = (uint)(ushort)CVar10;
          goto LAB_00d26cfb;
        }
        uVar23 = (uint)local_40;
        if ((CVar21 == 0xffffffff || (uint)local_40 != 0xffffffff) ||
           (EVar9 = ECLookahead(pPVar20,1), EVar9 == L']')) {
          ECConsume(pPVar20,1);
          bVar5 = 0;
          CVar21 = 0x2d;
        }
        else {
          ECConsume(pPVar20,1);
          bVar5 = 0;
          CVar19 = 0xffffffff;
          uVar23 = CVar21;
        }
      }
    }
    else {
      uVar23 = pSVar2->value;
      n = pSVar2->length;
      if (pPVar20->inputLim < pPVar20->next + n) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = puStack_50;
        *puStack_50 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x86b,"(ECCanConsume(this->currentSurrogatePairNode->length))",
                           "ECCanConsume(this->currentSurrogatePairNode->length)");
        if (!bVar7) goto LAB_00d2747f;
        *puVar13 = 0;
        n = pPVar20->currentSurrogatePairNode->length;
      }
      ECConsumeMultiUnit(pPVar20,n);
      pPVar20->currentSurrogatePairNode = pPVar20->currentSurrogatePairNode->next;
LAB_00d26cfb:
      bVar5 = 0;
      CVar21 = uVar23;
      uVar23 = (uint)local_40;
    }
    pPVar20 = local_48;
    puVar13 = puStack_50;
    if ((bool)(~bVar6 & CVar19 == 0xffffffff)) {
      local_40 = (MatchSetNode *)CONCAT44(local_40._4_4_,uVar23);
    }
    else {
      if (bVar6) {
        if (local_48->unicodeFlagPresent == true) {
          Fail(local_48,-0x7ff5e9d3);
        }
        pPVar20 = local_48;
        if (CVar21 != 0xffffffff) {
          CharSet<unsigned_int>::Set
                    ((CharSet<unsigned_int> *)local_3b8,local_48->ctAllocator,CVar21);
        }
        CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,0x2d);
      }
      else {
        if (uVar23 == 0xffffffff) {
          CharSet<unsigned_int>::Set
                    ((CharSet<unsigned_int> *)local_3b8,local_48->ctAllocator,CVar19);
          local_40 = (MatchSetNode *)CONCAT44(local_40._4_4_,0xffffffff);
          goto LAB_00d26e02;
        }
        if (CVar21 < uVar23) {
          if (local_48->unicodeFlagPresent == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x8bd,"(!unicodeFlagPresent)","!unicodeFlagPresent");
            if (!bVar6) goto LAB_00d2747f;
            *puVar13 = 0;
          }
          Fail(local_48,-0x7ff5ec63);
        }
        pPVar20 = local_48;
        CharSet<unsigned_int>::SetRange
                  ((CharSet<unsigned_int> *)local_3b8,local_48->ctAllocator,uVar23,CVar21);
      }
      CVar21 = 0xffffffff;
      local_40 = (MatchSetNode *)CONCAT44(local_40._4_4_,0xffffffff);
    }
LAB_00d26e02:
    EVar9 = ECLookahead(pPVar20,0);
    bVar6 = bVar4;
    bVar4 = (bool)(bVar5 & EVar9 == L'-');
  }
  if (CVar21 != 0xffffffff) {
    CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b8,local_48->ctAllocator,CVar21);
  }
  puVar13 = puStack_50;
  if (pPVar20->unicodeFlagPresent == false) {
    uVar11 = CharSet<char16_t>::Count((CharSet<char16_t> *)local_3b8);
    uVar12 = CharSet<unsigned_int>::Count((CharSet<unsigned_int> *)local_3b8);
    if (uVar11 != uVar12) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = puStack_50;
      *puStack_50 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x8e2,"(codePointSet.SimpleCharCount() == codePointSet.Count())",
                         "codePointSet.SimpleCharCount() == codePointSet.Count()");
      if (!bVar6) goto LAB_00d2747f;
      *puVar13 = 0;
    }
    pMVar15 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,pPVar20->ctAllocator,0x35916e);
    MatchSetNode::MatchSetNode(pMVar15,EVar8 == L'^',true);
    allocator = pPVar20->ctAllocator;
    pCVar22 = (CharSet<unsigned_int> *)local_3b8;
  }
  else {
    if (((pPVar20->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x8e9,"(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                         "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
      if (!bVar6) goto LAB_00d2747f;
      *puVar13 = 0;
    }
    bVar6 = CharSet<unsigned_int>::IsEmpty((CharSet<unsigned_int> *)local_3b8);
    if (bVar6) {
      pMVar15 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,pPVar20->ctAllocator,0x35916e);
      MatchSetNode::MatchSetNode(pMVar15,false,false);
      return &pMVar15->super_Node;
    }
    if (((EVar8 != L'^') && (pPVar20->caseInsensitiveFlagPresent == false)) &&
       (bVar6 = CharSet<unsigned_int>::IsSingleton((CharSet<unsigned_int> *)local_3b8), bVar6)) {
      codePointValue = CharSet<unsigned_int>::Singleton((CharSet<unsigned_int> *)local_3b8);
      if (codePointValue < 0x10000) {
        pMVar15 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x48,pPVar20->ctAllocator,0x35916e);
        MatchCharNode::MatchCharNode((MatchCharNode *)pMVar15,(Char)codePointValue);
      }
      else {
        if (pPVar20->unicodeFlagPresent == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x902,"(unicodeFlagPresent)","unicodeFlagPresent");
          if (!bVar6) goto LAB_00d2747f;
          *puVar13 = 0;
        }
        Js::NumberUtilities::CodePointAsSurrogatePair
                  (codePointValue,(char16 *)local_908,
                   (char16 *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8));
        pMVar15 = (MatchSetNode *)
                  CreateSurrogatePairAtom
                            (pPVar20,local_908._0_2_,
                             negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_);
      }
      CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator);
      return &pMVar15->super_Node;
    }
    CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_908);
    pCVar22 = (CharSet<unsigned_int> *)local_3b8;
    if (pPVar20->caseInsensitiveFlagPresent == false) {
      if (EVar8 == L'^') {
        CharSet<unsigned_int>::ToComplement
                  ((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,
                   (CharSet<unsigned_int> *)local_908);
        puVar13 = puStack_50;
        CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator);
        pCVar22 = (CharSet<unsigned_int> *)local_908;
      }
    }
    else {
      puVar1 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
      CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)puVar1);
      CharSet<unsigned_int>::ToEquivClass
                ((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,
                 (CharSet<unsigned_int> *)puVar1);
      uVar11 = CharSet<unsigned_int>::Count((CharSet<unsigned_int> *)puVar1);
      uVar12 = CharSet<unsigned_int>::Count((CharSet<unsigned_int> *)local_3b8);
      if (uVar11 < uVar12) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x925,"(caseEquivalent.Count() >= codePointSet.Count())",
                           "caseEquivalent.Count() >= codePointSet.Count()");
        if (!bVar6) goto LAB_00d2747f;
        *puVar13 = 0;
      }
      if (EVar8 == L'^') {
        CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator);
        puVar1 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
        CharSet<unsigned_int>::ToComplement
                  ((CharSet<unsigned_int> *)puVar1,pPVar20->ctAllocator,
                   (CharSet<unsigned_int> *)local_3b8);
        puVar13 = puStack_50;
        CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)puVar1,pPVar20->ctAllocator);
      }
      else {
        CharSet<unsigned_int>::CloneFrom
                  ((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,
                   (CharSet<unsigned_int> *)
                   (negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6));
      }
    }
    uVar11 = CharSet<unsigned_int>::Count(pCVar22);
    uVar12 = CharSet<char16_t>::Count(pCVar22->characterPlanes);
    if (uVar11 != uVar12) {
      if (uVar12 == 0) {
        pMVar17 = (MatchSetNode *)0x0;
        pMVar15 = (MatchSetNode *)0x0;
      }
      else {
        bVar6 = CharSet<unsigned_int>::ContainSurrogateCodeUnits(pCVar22);
        pMVar15 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,pPVar20->ctAllocator,0x35916e);
        MatchSetNode::MatchSetNode(pMVar15,false,false);
        if (bVar6) {
          CharSet<unsigned_int>::CloneNonSurrogateCodeUnitsTo
                    (pCVar22,pPVar20->ctAllocator,&pMVar15->set);
          pMVar17 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,pPVar20->ctAllocator,0x35916e);
          MatchSetNode::MatchSetNode(pMVar17,false,false);
          CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo
                    (pCVar22,pPVar20->ctAllocator,&pMVar17->set);
          puVar13 = puStack_50;
        }
        else {
          CharSet<unsigned_int>::CloneSimpleCharsTo(pCVar22,pPVar20->ctAllocator,&pMVar15->set);
          pMVar17 = (MatchSetNode *)0x0;
          puVar13 = puStack_50;
        }
      }
      if (pPVar20->unicodeFlagPresent == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x954,"(unicodeFlagPresent)","unicodeFlagPresent");
        if (!bVar6) {
LAB_00d2747f:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar13 = 0;
      }
      local_40 = pMVar17;
      if (pMVar15 == (MatchSetNode *)0x0) {
        pMVar17 = (MatchSetNode *)0x0;
      }
      else {
        pMVar17 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x60,pPVar20->ctAllocator,0x35916e);
        AltNode::AltNode((AltNode *)pMVar17,&pMVar15->super_Node,(AltNode *)0x0);
      }
      negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] = 0;
      local_54 = 0;
      CVar21 = 0x10000;
      pMVar15 = pMVar17;
      do {
        bVar6 = CharSet<unsigned_int>::GetNextRange
                          (pCVar22,CVar21,
                           (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                           &local_54);
        pMVar18 = local_40;
        if (!bVar6) {
          if (local_40 != (MatchSetNode *)0x0) {
            this_00 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar20->ctAllocator,0x35916e);
            AltNode::AltNode(this_00,&pMVar18->super_Node,(AltNode *)0x0);
            (pMVar17->set).rep.full.root = (CharSetNode *)this_00;
            pPVar20 = local_48;
          }
          CharSet<unsigned_int>::Clear(pCVar22,pPVar20->ctAllocator);
          if (pMVar15 != (MatchSetNode *)0x0) {
            if ((pMVar15->set).rep.compact.countPlusOne != 0) {
              return &pMVar15->super_Node;
            }
            uVar16._0_1_ = pMVar15->isNegation;
            uVar16._1_1_ = pMVar15->needsEquivClass;
            uVar16._2_6_ = *(undefined6 *)&pMVar15->field_0x3a;
            return (Node *)uVar16;
          }
          return &((MatchSetNode *)0x0)->super_Node;
        }
        if (negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] == local_54) {
          pMVar18 = (MatchSetNode *)
                    AppendSurrogatePairToDisjunction
                              (pPVar20,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                               (AltNode *)pMVar17);
        }
        else {
          pMVar18 = (MatchSetNode *)
                    AppendSurrogateRangeToDisjunction
                              (pPVar20,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                               local_54,(AltNode *)pMVar17);
        }
        if (pMVar15 == (MatchSetNode *)0x0) {
          pMVar15 = pMVar18;
        }
        if (pMVar18 == (MatchSetNode *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = puStack_50;
          *puStack_50 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x96a,"(currentTail != nullptr)","currentTail != nullptr");
          if (!bVar6) goto LAB_00d2747f;
          *puVar13 = 0;
        }
        do {
          pMVar17 = pMVar18;
          pMVar18 = (MatchSetNode *)(pMVar17->set).rep.full.root;
        } while (pMVar18 != (MatchSetNode *)0x0);
        CVar21 = local_54 + 1;
      } while( true );
    }
    pMVar15 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,pPVar20->ctAllocator,0x35916e);
    MatchSetNode::MatchSetNode(pMVar15,EVar8 == L'^',true);
    allocator = pPVar20->ctAllocator;
  }
  CharSet<unsigned_int>::CloneSimpleCharsTo(pCVar22,allocator,&pMVar15->set);
  return &pMVar15->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::CharacterClassPass1()
    {
        Assert(containsSurrogates ? unicodeFlagPresent : true);

        CharSet<codepoint_t> codePointSet;

        MatchSetNode deferredSetNode(false, false);
        MatchCharNode deferredCharNode(0);

        bool isNegation = false;

        if (ECLookahead() == '^')
        {
            isNegation = true;
            ECConsume();
        }

        // We aren't expecting any terminating null characters, only embedded ones that should treated as valid characters.
        // CharacterClassPass0 should have taken care of terminating null.
        codepoint_t pendingCodePoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        EncodedChar nextChar = ECLookahead();
        bool previousWasASurrogate = false;
        bool currIsACharSet = false;
        bool prevWasACharSetAndPartOfRange = false;
        bool prevprevWasACharSetAndPartOfRange = false;

        while(nextChar != ']')
        {
            codepoint_t codePointToSet = INVALID_CODEPOINT;

            // Consume ahead of time if we have two backslashes, both cases below (previously Tracked surrogate pair, and ClassEscapePass1) assume it is.
            if (nextChar == '\\')
            {
                ECConsume();
            }

            // These if-blocks are the logical ClassAtomPass1, they weren't grouped into a method to simplify dealing with multiple out parameters.
            if (containsSurrogates && this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
            {
                codePointToSet = pendingCodePoint;

                pendingCodePoint = this->currentSurrogatePairNode->value;
                Assert(ECCanConsume(this->currentSurrogatePairNode->length));
                ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
                this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
                this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
            }
            else if (nextChar == '\\')
            {
                Node* returnedNode = ClassEscapePass1(&deferredCharNode, &deferredSetNode, previousWasASurrogate);
                codePointToSet = pendingCodePoint;

                if (returnedNode->tag == Node::MatchSet)
                {
                    if (pendingRangeStart != INVALID_CODEPOINT)
                    {
                        if (unicodeFlagPresent)
                        {
                            //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                            //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                            Fail(JSERR_UnicodeRegExpRangeContainsCharClass); //From #sec-patterns-static-semantics-early-errors-annexb
                        }

                        codePointSet.Set(ctAllocator, '-');
                    }

                    pendingCodePoint = INVALID_CODEPOINT;
                    pendingRangeStart = INVALID_CODEPOINT;
                    codePointSet.UnionInPlace(ctAllocator, deferredSetNode.set);
                    currIsACharSet = true;
                }
                else
                {
                    // Just a character
                    pendingCodePoint = deferredCharNode.cs[0];
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || pendingCodePoint == INVALID_CODEPOINT || ECLookahead(1) == ']')
                {
                    // - is just a char, or end of a range.
                    codePointToSet = pendingCodePoint;
                    pendingCodePoint = '-';
                    ECConsume();
                }
                else
                {
                    pendingRangeStart = pendingCodePoint;
                    ECConsume();
                }
            }
            else
            {
                // Just a character, consume it
                codePointToSet = pendingCodePoint;
                pendingCodePoint = NextChar();
            }

            if (codePointToSet != INVALID_CODEPOINT || prevprevWasACharSetAndPartOfRange)
            {
                if (prevprevWasACharSetAndPartOfRange)
                {
                    //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                    //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                    if (unicodeFlagPresent)
                    {
                        Fail(JSERR_UnicodeRegExpRangeContainsCharClass);
                    }

                    if (pendingCodePoint != INVALID_CODEPOINT)
                    {
                        codePointSet.Set(ctAllocator, pendingCodePoint);
                    }

                    codePointSet.Set(ctAllocator, '-'); //Add '-' to set because a range was detected but turned out to be a union of character set with '-' and another atom.
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else if (pendingRangeStart != INVALID_CODEPOINT)
                {
                    if (pendingRangeStart > pendingCodePoint)
                    {
                        //We have no unicodeFlag, but current range contains surrogates, thus we may end up having to throw a "Syntax" error here
                        //This breaks the notion of Pass0 check for valid syntax, because we don't know if we have a unicode option
                        Assert(!unicodeFlagPresent);
                        Fail(JSERR_RegExpBadRange);
                    }
                    
                    codePointSet.SetRange(ctAllocator, pendingRangeStart, pendingCodePoint);
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else
                {
                    codePointSet.Set(ctAllocator, codePointToSet);
                }
            }

            nextChar = ECLookahead();
            prevprevWasACharSetAndPartOfRange = prevWasACharSetAndPartOfRange;
            prevWasACharSetAndPartOfRange = currIsACharSet && nextChar == '-';
            currIsACharSet = false;
        }

        if (pendingCodePoint != INVALID_CODEPOINT)
        {
            codePointSet.Set(ctAllocator, pendingCodePoint);
        }

        // At this point, we have a complete set of codepoints representing the range.
        // Before performing translation of any kind, we need to do some case filling.
        // At the point of this comment, there are no case mappings going cross-plane between simple
        // characters (< 0x10000) and supplementary characters (>= 0x10000)
        // However, it might still be the case, and this has to be handled.

        // On the other hand, we don't want to prevent optimizations that expect non-casefolded sets from happening.
        // At least for simple characters.

        // The simple case, is when the unicode flag isn't specified, we can go ahead and return the simple set.
        // Negations and case mappings will be handled later.
        if (!unicodeFlagPresent)
        {
            Assert(codePointSet.SimpleCharCount() == codePointSet.Count());
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            codePointSet.CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        // Everything past here must be under the flag
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        if (codePointSet.IsEmpty())
        {
            return Anew(ctAllocator, MatchSetNode, false, false);
        }

        Node* prefixNode = nullptr;
        Node* suffixNode = nullptr;

        CharSet<codepoint_t> *toUseForTranslation = &codePointSet;

        // If a singleton, return a simple character
        bool isSingleton = !this->caseInsensitiveFlagPresent && !isNegation && codePointSet.IsSingleton();
        if (isSingleton)
        {
            codepoint_t singleton = codePointSet.Singleton();
            Node* toReturn = nullptr;

            if (singleton < 0x10000)
            {
                toReturn = Anew(ctAllocator, MatchCharNode, (char16)singleton);
            }
            else
            {
                Assert(unicodeFlagPresent);
                char16 lowerSurrogate, upperSurrogate;
                Js::NumberUtilities::CodePointAsSurrogatePair(singleton, &lowerSurrogate, &upperSurrogate);
                toReturn = CreateSurrogatePairAtom(lowerSurrogate, upperSurrogate);
            }

            codePointSet.Clear(ctAllocator);
            return toReturn;
        }

        // If negation, we want to complement the simple chars.
        // When a set is negated, optimizations skip checking if applicable, so we can go ahead and negate it here.
        CharSet<codepoint_t> negatedSet;

        if (!this->caseInsensitiveFlagPresent)
        {
            if (isNegation)
            {
                // Complement all characters, and use it as the set toTranslate
                codePointSet.ToComplement(ctAllocator, negatedSet);
            }

            toUseForTranslation = isNegation ? &negatedSet : &codePointSet;

            if (isNegation)
            {
                // Clear this, as we will no longer need this.
                codePointSet.FreeBody(ctAllocator);
            }
        }
        else
        {
            CharSet<codepoint_t> caseEquivalent;
            codePointSet.ToEquivClass(ctAllocator, caseEquivalent);
            // Equiv set can't have a reduced count of chars
            Assert(caseEquivalent.Count() >= codePointSet.Count());

            // Here we have a regex that has both case insensitive and unicode options.
            // The range might also be negated. If it is negated, we can go ahead and negate
            // the entire set as well as fill in cases, as optimizations wouldn't kick in anyways.
            if (isNegation)
            {
                codePointSet.Clear(ctAllocator);
                caseEquivalent.ToComplement(ctAllocator, codePointSet);
                caseEquivalent.FreeBody(ctAllocator);
            }
            else
            {
                codePointSet.CloneFrom(ctAllocator, caseEquivalent);
            }

            Assert(toUseForTranslation == &codePointSet);
        }

        uint totalCodePointsCount = toUseForTranslation->Count();
        uint simpleCharsCount = toUseForTranslation->SimpleCharCount();
        if (totalCodePointsCount == simpleCharsCount)
        {
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            toUseForTranslation->CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        if  (simpleCharsCount > 0)
        {
            if (!toUseForTranslation->ContainSurrogateCodeUnits())
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSimpleCharsTo(ctAllocator, node->set);
                prefixNode = node;
            }
            else
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneNonSurrogateCodeUnitsTo(ctAllocator, node->set);
                prefixNode = node;
                node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSurrogateCodeUnitsTo(ctAllocator, node->set);
                suffixNode = node;
            }
        }

        Assert(unicodeFlagPresent);
        AltNode *headToReturn = prefixNode == nullptr ? nullptr : Anew(ctAllocator, AltNode, prefixNode, nullptr);
        AltNode *currentTail = headToReturn;

        codepoint_t charRangeSearchIndex = 0x10000, lowerCharOfRange = 0, upperCharOfRange = 0;

        while (toUseForTranslation->GetNextRange(charRangeSearchIndex, &lowerCharOfRange, &upperCharOfRange))
        {
            if (lowerCharOfRange == upperCharOfRange)
            {
                currentTail = this->AppendSurrogatePairToDisjunction(lowerCharOfRange, currentTail);
            }
            else
            {
                currentTail = this->AppendSurrogateRangeToDisjunction(lowerCharOfRange, upperCharOfRange, currentTail);
            }

            if (headToReturn == nullptr)
            {
                headToReturn = currentTail;
            }

            AnalysisAssert(currentTail != nullptr);
            while (currentTail->tail != nullptr)
            {
                currentTail = currentTail->tail;
            }
            charRangeSearchIndex = upperCharOfRange + 1;
        }

        if (suffixNode != nullptr)
        {
            currentTail->tail = Anew(ctAllocator, AltNode, suffixNode, nullptr);
        }
        toUseForTranslation->Clear(ctAllocator);

        if (headToReturn != nullptr && headToReturn->tail == nullptr)
        {
            return headToReturn->head;
        }
        return headToReturn;
    }